

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O3

LngLat mercatortile::ul(Tile *tile)

{
  double dVar1;
  double dVar2;
  LngLat LVar3;
  
  dVar1 = ldexp(1.0,tile->z);
  dVar2 = sinh((1.0 - ((double)tile->y + (double)tile->y) / dVar1) * 3.141592653589793);
  dVar2 = atan(dVar2);
  LVar3.lat = (dVar2 * 180.0) / 3.141592653589793;
  LVar3.lng = ((double)tile->x / dVar1) * 360.0 + -180.0;
  return LVar3;
}

Assistant:

LngLat ul(const Tile &tile)
{
    LngLat lonlat;
    double n = pow(2.0, tile.z);
    double lat_rad = atan(sinh(M_PI * (1.0 - 2.0 * tile.y / n)));
    lonlat.lat = lat_rad * 180.0 / M_PI;
    lonlat.lng = tile.x / n * 360.0 - 180.0;

    return lonlat;
}